

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers
          (TracingServiceImpl *this,TracingSession *tracing_session,ProducerEndpointImpl *producer)

{
  ProducerID producer_id_trusted;
  BufferID buffer_id;
  ChunkID chunk_id_00;
  uid_t producer_uid_trusted;
  pid_t producer_pid_trusted;
  undefined2 writer_id_00;
  uint8_t chunk_flags;
  ushort num_fragments;
  undefined1 uVar1;
  bool bVar2;
  uint32_t page_layout;
  ChunkState CVar3;
  pair<unsigned_short,_unsigned_char> pVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  const_iterator __first;
  const_iterator __last;
  SharedMemoryABI *this_01;
  size_t sVar5;
  unsigned_short *puVar6;
  ChunkHeader *pCVar7;
  uint8_t *src;
  const_iterator cStack_f0;
  uint32_t chunk_id;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_e8;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_e0;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_d8;
  undefined1 local_cf;
  undefined1 local_ce [6];
  bool target_buffer_belongs_to_session;
  Optional<unsigned_short> target_buffer_id;
  WriterID writer_id;
  pair<unsigned_short,_unsigned_char> local_b8;
  uint8_t local_b3;
  ushort local_b2;
  undefined1 local_b0 [5];
  uint8_t flags;
  uint16_t packet_count;
  Chunk chunk;
  uint uStack_94;
  bool chunk_complete;
  ChunkState state;
  uint32_t chunk_idx;
  uint32_t used_chunks;
  uint32_t layout;
  size_t page_idx;
  SharedMemoryABI *abi;
  bool producer_in_session;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *session_buffers;
  ProducerEndpointImpl *producer_local;
  TracingSession *tracing_session_local;
  TracingServiceImpl *this_local;
  memory_order __b;
  
  if (((producer->smb_scraping_enabled_ & 1U) != 0) &&
     (bVar2 = std::
              map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
              ::empty(&producer->writers_), !bVar2)) {
    this_00 = &tracing_session->buffers_index;
    __first = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(this_00);
    __last = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(this_00);
    bVar2 = ::std::
            any_of<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,perfetto::TracingServiceImpl::ScrapeSharedMemoryBuffers(perfetto::TracingServiceImpl::TracingSession*,perfetto::TracingServiceImpl::ProducerEndpointImpl*)::__0>
                      ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        )__last._M_current,(anon_class_8_1_ac17f510_for__M_pred)producer);
    if (bVar2) {
      perfetto::base::ignore_result<char[29],unsigned_short>
                ((char (*) [29])"Scraping SMB for producer %u",&producer->id_);
      this_01 = &producer->shmem_abi_;
      for (_used_chunks = 0; sVar5 = SharedMemoryABI::num_pages(this_01), _used_chunks < sVar5;
          _used_chunks = _used_chunks + 1) {
        page_layout = SharedMemoryABI::GetPageLayout(this_01,_used_chunks);
        state = SharedMemoryABI::GetUsedChunks(page_layout);
        if (state != kChunkFree) {
          uStack_94 = 0;
          for (; state != kChunkFree; state = state >> 1) {
            if ((state & kChunkBeingWritten) != kChunkFree) {
              CVar3 = SharedMemoryABI::GetChunkStateFromLayout(page_layout,(ulong)uStack_94);
              chunk._15_1_ = CVar3 == kChunkComplete;
              SharedMemoryABI::GetChunkUnchecked
                        ((SharedMemoryABI *)local_b0,(size_t)this_01,(uint32_t)_used_chunks,
                         (ulong)page_layout);
              pVar4 = SharedMemoryABI::Chunk::GetPacketCountAndFlags((Chunk *)local_b0);
              local_b8.first = pVar4.first;
              local_b8.second = pVar4.second;
              ::std::tie<unsigned_short,unsigned_char>
                        ((unsigned_short *)&stack0xffffffffffffff38,(uchar *)&local_b2);
              ::std::tuple<unsigned_short&,unsigned_char&>::operator=
                        ((tuple<unsigned_short&,unsigned_char&> *)&stack0xffffffffffffff38,&local_b8
                        );
              if (((chunk._15_1_ & 1) != 0) || (1 < local_b2)) {
                local_ce._4_2_ = SharedMemoryABI::Chunk::writer_id((Chunk *)local_b0);
                ProducerEndpointImpl::buffer_id_for_writer
                          ((ProducerEndpointImpl *)local_ce,(WriterID)producer);
                bVar2 = perfetto::base::Optional::operator_cast_to_bool((Optional *)local_ce);
                if (bVar2) {
                  local_e0._M_current =
                       (unsigned_short *)
                       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(this_00);
                  local_e8._M_current =
                       (unsigned_short *)
                       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(this_00);
                  puVar6 = perfetto::base::Optional<unsigned_short>::operator*
                                     ((Optional<unsigned_short> *)local_ce);
                  local_d8 = ::std::
                             find<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_short>
                                       (local_e0,local_e8,puVar6);
                  cStack_f0 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                                        (this_00);
                  local_cf = __gnu_cxx::operator!=(&local_d8,&stack0xffffffffffffff10);
                  if ((bool)local_cf) {
                    pCVar7 = SharedMemoryABI::Chunk::header((Chunk *)local_b0);
                    ::std::operator&(memory_order_relaxed,__memory_order_mask);
                    writer_id_00 = local_ce._4_2_;
                    chunk_id_00 = (pCVar7->chunk_id).super___atomic_base<unsigned_int>._M_i;
                    producer_id_trusted = producer->id_;
                    producer_uid_trusted = producer->uid_;
                    producer_pid_trusted = producer->pid_;
                    puVar6 = perfetto::base::Optional<unsigned_short>::operator*
                                       ((Optional<unsigned_short> *)local_ce);
                    uVar1 = chunk._15_1_;
                    num_fragments = local_b2;
                    chunk_flags = local_b3;
                    buffer_id = *puVar6;
                    src = SharedMemoryABI::Chunk::payload_begin((Chunk *)local_b0);
                    sVar5 = SharedMemoryABI::Chunk::payload_size((Chunk *)local_b0);
                    CopyProducerPageIntoLogBuffer
                              (this,producer_id_trusted,producer_uid_trusted,producer_pid_trusted,
                               writer_id_00,chunk_id_00,buffer_id,num_fragments,chunk_flags,
                               (bool)(uVar1 & 1),src,sVar5);
                  }
                }
              }
            }
            uStack_94 = uStack_94 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::ScrapeSharedMemoryBuffers(
    TracingSession* tracing_session,
    ProducerEndpointImpl* producer) {
  if (!producer->smb_scraping_enabled_)
    return;

  // Can't copy chunks if we don't know about any trace writers.
  if (producer->writers_.empty())
    return;

  // Performance optimization: On flush or session disconnect, this method is
  // called for each producer. If the producer doesn't participate in the
  // session, there's no need to scape its chunks right now. We can tell if a
  // producer participates in the session by checking if the producer is allowed
  // to write into the session's log buffers.
  const auto& session_buffers = tracing_session->buffers_index;
  bool producer_in_session =
      std::any_of(session_buffers.begin(), session_buffers.end(),
                  [producer](BufferID buffer_id) {
                    return producer->allowed_target_buffers_.count(buffer_id);
                  });
  if (!producer_in_session)
    return;

  PERFETTO_DLOG("Scraping SMB for producer %" PRIu16, producer->id_);

  // Find and copy any uncommitted chunks from the SMB.
  //
  // In nominal conditions, the page layout of the used SMB pages should never
  // change because the service is the only one who is supposed to modify used
  // pages (to make them free again).
  //
  // However, the code here needs to deal with the case of a malicious producer
  // altering the SMB in unpredictable ways. Thankfully the SMB size is
  // immutable, so a chunk will always point to some valid memory, even if the
  // producer alters the intended layout and chunk header concurrently.
  // Ultimately a malicious producer altering the SMB's chunk layout while we
  // are iterating in this function is not any different from the case of a
  // malicious producer asking to commit a chunk made of random data, which is
  // something this class has to deal with regardless.
  //
  // The only legitimate mutations that can happen from sane producers,
  // concurrently to this function, are:
  //   A. free pages being partitioned,
  //   B. free chunks being migrated to kChunkBeingWritten,
  //   C. kChunkBeingWritten chunks being migrated to kChunkCompleted.

  SharedMemoryABI* abi = &producer->shmem_abi_;
  // num_pages() is immutable after the SMB is initialized and cannot be changed
  // even by a producer even if malicious.
  for (size_t page_idx = 0; page_idx < abi->num_pages(); page_idx++) {
    uint32_t layout = abi->GetPageLayout(page_idx);

    uint32_t used_chunks = abi->GetUsedChunks(layout);  // Returns a bitmap.
    // Skip empty pages.
    if (used_chunks == 0)
      continue;

    // Scrape the chunks that are currently used. These should be either in
    // state kChunkBeingWritten or kChunkComplete.
    for (uint32_t chunk_idx = 0; used_chunks; chunk_idx++, used_chunks >>= 1) {
      if (!(used_chunks & 1))
        continue;

      SharedMemoryABI::ChunkState state =
          SharedMemoryABI::GetChunkStateFromLayout(layout, chunk_idx);
      PERFETTO_DCHECK(state == SharedMemoryABI::kChunkBeingWritten ||
                      state == SharedMemoryABI::kChunkComplete);
      bool chunk_complete = state == SharedMemoryABI::kChunkComplete;

      SharedMemoryABI::Chunk chunk =
          abi->GetChunkUnchecked(page_idx, layout, chunk_idx);

      uint16_t packet_count;
      uint8_t flags;
      // GetPacketCountAndFlags has acquire_load semantics.
      std::tie(packet_count, flags) = chunk.GetPacketCountAndFlags();

      // It only makes sense to copy an incomplete chunk if there's at least
      // one full packet available. (The producer may not have completed the
      // last packet in it yet, so we need at least 2.)
      if (!chunk_complete && packet_count < 2)
        continue;

      // At this point, it is safe to access the remaining header fields of
      // the chunk. Even if the chunk was only just transferred from
      // kChunkFree into kChunkBeingWritten state, the header should be
      // written completely once the packet count increased above 1 (it was
      // reset to 0 by the service when the chunk was freed).

      WriterID writer_id = chunk.writer_id();
      base::Optional<BufferID> target_buffer_id =
          producer->buffer_id_for_writer(writer_id);

      // We can only scrape this chunk if we know which log buffer to copy it
      // into.
      if (!target_buffer_id)
        continue;

      // Skip chunks that don't belong to the requested tracing session.
      bool target_buffer_belongs_to_session =
          std::find(session_buffers.begin(), session_buffers.end(),
                    *target_buffer_id) != session_buffers.end();
      if (!target_buffer_belongs_to_session)
        continue;

      uint32_t chunk_id =
          chunk.header()->chunk_id.load(std::memory_order_relaxed);

      CopyProducerPageIntoLogBuffer(
          producer->id_, producer->uid_, producer->pid_, writer_id, chunk_id,
          *target_buffer_id, packet_count, flags, chunk_complete,
          chunk.payload_begin(), chunk.payload_size());
    }
  }
}